

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
DictionaryInstance::receive
          (string *__return_storage_ptr__,DictionaryInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)message_name);
  if (iVar1 == 0) {
    op_get(__return_storage_ptr__,this,arguments);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)message_name);
    if (iVar1 == 0) {
      op_isEmpty(__return_storage_ptr__,this,arguments);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)message_name);
      if (iVar1 == 0) {
        op_containsKey(__return_storage_ptr__,this,arguments);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)message_name);
        if (iVar1 == 0) {
          op_size(__return_storage_ptr__,this,arguments);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)message_name);
          if (iVar1 == 0) {
            op_keys(__return_storage_ptr__,this,arguments);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)message_name);
            if (iVar1 == 0) {
              op_values(__return_storage_ptr__,this,arguments);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)message_name);
              if (iVar1 == 0) {
                op_getValueForKey(__return_storage_ptr__,this,arguments);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)message_name);
                if (iVar1 == 0) {
                  op_associateValue_withKey(__return_storage_ptr__,this,arguments);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)message_name);
                  if (iVar1 == 0) {
                    op_removeKey(__return_storage_ptr__,this,arguments);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)message_name);
                    if (iVar1 != 0) {
                      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar2 = "RuntimeError: invalid message.";
                      __cxa_throw(puVar2,&char_const*::typeinfo,0);
                    }
                    op_clear(__return_storage_ptr__,this,arguments);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DictionaryInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "isEmpty?")
        return op_isEmpty(arguments);
    if (message_name == "containsKey?")
        return op_containsKey(arguments);
    if (message_name == "size")
        return op_size(arguments);
    if (message_name == "keys")
        return op_keys(arguments);
    if (message_name == "values")
        return op_values(arguments);
    if (message_name == "getValueForKey:")
        return op_getValueForKey(arguments);
    if (message_name == "associateValue:withKey:")
        return op_associateValue_withKey(arguments);
    if (message_name == "removeKey:")
        return op_removeKey(arguments);
    if (message_name == "clear")
        return op_clear(arguments);
    throw EXC_INVALID_MESSAGE;
}